

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O3

void mcbsp_send(mcbsp_pid_t pid,void *tag,void *payload,mcbsp_size_t size)

{
  size_t sVar1;
  Time t;
  TicToc local_68;
  timespec local_48;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_send: can only be called within SPMD section\n");
  }
  if ((uint)s_spmd->m_nprocs < pid) {
    bsp_abort("bsp_send: The source process ID does not exist\n");
  }
  if (size == 0xffffffffffffffff) {
    bsp_abort("bsp_send: Invalid payload size, because it is also used as end marker\n");
  }
  sVar1 = s_bsmp->m_send_tag_size;
  local_68.m_record = bsplib::TicToc::push(BSMP);
  clock_gettime(1,&local_48);
  local_68.m_start.tv_sec = local_48.tv_sec;
  local_68.m_start.tv_nsec = local_48.tv_nsec;
  local_68.m_nbytes = sVar1 + size;
  bsplib::Bsmp::send(s_bsmp,pid,tag,(size_t)payload,(int)size);
  bsplib::TicToc::~TicToc(&local_68);
  return;
}

Assistant:

void mcbsp_send( mcbsp_pid_t pid, const void * tag, 
             const void * payload, mcbsp_size_t size )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_send: can only be called within SPMD section\n");

    if (pid > mcbsp_pid_t(s_spmd->nprocs()))
        bsp_abort("bsp_send: The source process ID does not exist\n");

    if (size == mcbsp_size_t(-1))
        bsp_abort("bsp_send: Invalid payload size, because it is also "
                 "used as end marker\n");

#ifdef PROFILE
    TicToc t( TicToc::BSMP, s_bsmp->send_tag_size() + size );
#endif

    s_bsmp->send( pid, tag, payload, size );
}